

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lar2par.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream *this;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  allocator local_3fd;
  int num_order;
  string local_3f8;
  vector<double,_std::allocator<double>_> coefficients;
  LogAreaRatioToParcorCoefficients log_area_ratio_to_parcor_coefficients;
  ostringstream error_message_3;
  ifstream ifs;
  byte abStack_218 [488];
  
  num_order = 0x19;
  while (iVar3 = ya_getopt_long(argc,argv,"m:h",(option *)0x0,(int *)0x0), iVar3 == 0x6d) {
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_3);
    bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
    bVar7 = num_order < 0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar1 || bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
      std::operator<<(poVar4,"non-negative integer");
      std::__cxx11::string::string((string *)&error_message_3,"lar2par",(allocator *)&local_3f8);
      sptk::PrintErrorMessage((string *)&error_message_3,(ostringstream *)&ifs);
LAB_001027f8:
      std::__cxx11::string::~string((string *)&error_message_3);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
      return 1;
    }
  }
  if (iVar3 != -1) {
    if (iVar3 != 0x68) {
      anon_unknown.dwarf_2ade::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    anon_unknown.dwarf_2ade::PrintUsage((ostream *)&std::cout);
    return 0;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Too many input files");
    std::__cxx11::string::string((string *)&error_message_3,"lar2par",(allocator *)&local_3f8);
    sptk::PrintErrorMessage((string *)&error_message_3,(ostringstream *)&ifs);
    goto LAB_001027f8;
  }
  if (argc == ya_optind) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = argv[ya_optind];
  }
  bVar1 = sptk::SetBinaryMode();
  this = (ostringstream *)&ifs;
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&error_message_3,"lar2par",(allocator *)&local_3f8);
    sptk::PrintErrorMessage((string *)&error_message_3,(ostringstream *)&ifs);
    goto LAB_001027f8;
  }
  std::ifstream::ifstream(this);
  if ((pcVar5 == (char *)0x0) ||
     (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar5),
     (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      this = (ostringstream *)&std::cin;
    }
    sptk::LogAreaRatioToParcorCoefficients::LogAreaRatioToParcorCoefficients
              (&log_area_ratio_to_parcor_coefficients,num_order);
    if (log_area_ratio_to_parcor_coefficients.is_valid_ != false) {
      lVar6 = (long)num_order;
      std::vector<double,_std::allocator<double>_>::vector
                (&coefficients,lVar6 + 1U,(allocator_type *)&error_message_3);
      do {
        iVar3 = (int)(lVar6 + 1U);
        bVar1 = sptk::ReadStream<double>(false,0,0,iVar3,&coefficients,(istream *)this,(int *)0x0);
        if (!bVar1) {
          iVar3 = 0;
          goto LAB_001029c6;
        }
        bVar1 = sptk::LogAreaRatioToParcorCoefficients::Run
                          (&log_area_ratio_to_parcor_coefficients,&coefficients);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_3);
          std::operator<<((ostream *)&error_message_3,
                          "Failed to convert log area ratio to PARCOR coefficients");
          std::__cxx11::string::string((string *)&local_3f8,"lar2par",&local_3fd);
          sptk::PrintErrorMessage(&local_3f8,&error_message_3);
          goto LAB_001029af;
        }
        bVar1 = sptk::WriteStream<double>(0,iVar3,&coefficients,(ostream *)&std::cout,(int *)0x0);
      } while (bVar1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_3);
      std::operator<<((ostream *)&error_message_3,"Failed to write PARCOR coefficients");
      std::__cxx11::string::string((string *)&local_3f8,"lar2par",&local_3fd);
      sptk::PrintErrorMessage(&local_3f8,&error_message_3);
LAB_001029af:
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_3);
      iVar3 = 1;
LAB_001029c6:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&coefficients.super__Vector_base<double,_std::allocator<double>_>);
      goto LAB_001029d0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_3);
    std::operator<<((ostream *)&error_message_3,
                    "Failed to initialize LogAreaRatioToParcorCoefficients");
    std::__cxx11::string::string((string *)&local_3f8,"lar2par",(allocator *)&coefficients);
    sptk::PrintErrorMessage(&local_3f8,&error_message_3);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_3);
    poVar4 = std::operator<<((ostream *)&error_message_3,"Cannot open file ");
    std::operator<<(poVar4,pcVar5);
    std::__cxx11::string::string((string *)&local_3f8,"lar2par",(allocator *)&coefficients);
    sptk::PrintErrorMessage(&local_3f8,&error_message_3);
  }
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_3);
  iVar3 = 1;
LAB_001029d0:
  std::ifstream::~ifstream(&ifs);
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lar2par", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lar2par", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lar2par", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lar2par", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::LogAreaRatioToParcorCoefficients log_area_ratio_to_parcor_coefficients(
      num_order);
  if (!log_area_ratio_to_parcor_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize LogAreaRatioToParcorCoefficients";
    sptk::PrintErrorMessage("lar2par", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> coefficients(length);

  while (sptk::ReadStream(false, 0, 0, length, &coefficients, &input_stream,
                          NULL)) {
    if (!log_area_ratio_to_parcor_coefficients.Run(&coefficients)) {
      std::ostringstream error_message;
      error_message
          << "Failed to convert log area ratio to PARCOR coefficients";
      sptk::PrintErrorMessage("lar2par", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, coefficients, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write PARCOR coefficients";
      sptk::PrintErrorMessage("lar2par", error_message);
      return 1;
    }
  }

  return 0;
}